

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_Indices_Test<unsigned_int>::TestBody(SparseArray_Indices_Test<unsigned_int> *this)

{
  indices *this_00;
  allocator<unsigned_long> *this_01;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  iterator last_index;
  iterator iVar2;
  type arr_00;
  back_insert_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> __result;
  char *message;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *matcher;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator __first;
  initializer_list<int> values;
  const_iterator __last;
  AssertHelper local_1b0;
  Message local_1a8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1a0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_188;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  unsigned_long local_158 [5];
  iterator local_130;
  size_type local_128;
  undefined1 local_120 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected;
  undefined1 local_d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> actual;
  undefined1 auStack_b8 [4];
  indices idc;
  unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
  local_98;
  unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
  arr;
  allocator<unsigned_long> local_7a;
  less<unsigned_long> local_79;
  unsigned_long local_78 [5];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> indices;
  SparseArray_Indices_Test<unsigned_int> *this_local;
  
  local_78[2] = 5;
  local_78[3] = 7;
  local_78[0] = 2;
  local_78[1] = 3;
  local_50 = local_78;
  local_48 = 4;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::allocator<unsigned_long>::allocator(&local_7a);
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_40,__l_00,&local_79,&local_7a);
  std::allocator<unsigned_long>::~allocator(&local_7a);
  last_index = std::
               begin<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                         ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)local_40);
  iVar2 = std::end<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )local_40);
  std::initializer_list<int>::initializer_list((initializer_list<int> *)auStack_b8);
  values._M_len = (size_type)_auStack_b8;
  values._M_array = (iterator)iVar2._M_node;
  pstore::sparse_array<int,unsigned_int>::make_unique<std::_Rb_tree_const_iterator<unsigned_long>>
            ((_Base_ptr)&local_98,(_Rb_tree_const_iterator<unsigned_long>)last_index._M_node,values)
  ;
  arr_00 = std::
           unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
           ::operator*(&local_98);
  this_00 = (indices *)
            ((long)&actual.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + 4);
  pstore::sparse_array<int,_unsigned_int>::indices::indices(this_00,arr_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  cVar3 = std::begin<pstore::sparse_array<int,unsigned_int>::indices>(this_00);
  cVar4 = std::end<pstore::sparse_array<int,unsigned_int>::indices>
                    ((indices *)
                     ((long)&actual.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  __result = std::back_inserter<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  __first._4_4_ = 0;
  __first.bitmap_ = cVar3.bitmap_;
  __last._4_4_ = 0;
  __last.bitmap_ = cVar4.bitmap_;
  __first.pos_ = cVar3.pos_;
  __last.pos_ = cVar4.pos_;
  expected.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                copy<pstore::sparse_array<int,unsigned_int>::indices::const_iterator,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          (__first,__last,__result);
  local_158[2] = 5;
  local_158[3] = 7;
  local_158[0] = 2;
  local_158[1] = 3;
  local_130 = local_158;
  local_128 = 4;
  this_01 = (allocator<unsigned_long> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<unsigned_long>::allocator(this_01);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120,__l,this_01);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::ContainerEq<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (&local_1a0,(testing *)local_120,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            (&local_188,(internal *)&local_1a0,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::operator()(local_170,(char *)&local_188,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)"actual");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_188);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~PolymorphicMatcher(&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x11d,message);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  std::
  unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
  ::~unique_ptr(&local_98);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_40);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Indices) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});

    typename sparse_array<int, TypeParam>::indices idc{*arr};
    std::vector<std::size_t> actual;
    std::copy (std::begin (idc), std::end (idc), std::back_inserter (actual));
    std::vector<std::size_t> const expected{2, 3, 5, 7};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}